

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O2

vector<ArFileEntry,_std::allocator<ArFileEntry>_> *
loadArArchive(vector<ArFileEntry,_std::allocator<ArFileEntry>_> *__return_storage_ptr__,
             path *inputName)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  size_t start;
  ulong uVar6;
  ByteArray input;
  char fileName [17];
  ArFileEntry entry;
  string local_50;
  
  ByteArray::fromFile(&input,inputName,0,0);
  (__return_storage_ptr__->super__Vector_base<ArFileEntry,_std::allocator<ArFileEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ArFileEntry,_std::allocator<ArFileEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ArFileEntry,_std::allocator<ArFileEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (input.size_ < 8) {
    if (input.size_ < 4) goto LAB_001635b2;
  }
  else if (*(long *)input.data_ == 0xa3e686372613c21) {
    uVar6 = 8;
    sVar2 = input.size_;
    while (uVar6 < sVar2) {
      start = uVar6 + 0x3c;
      iVar5 = 0;
      lVar4 = -10;
      while ((lVar4 != 0 && ((char)input.data_[lVar4 + uVar6 + 0x3a] != 0x20))) {
        iVar5 = iVar5 * 10 + (int)(char)input.data_[lVar4 + uVar6 + 0x3a] + -0x30;
        lVar4 = lVar4 + 1;
      }
      if (*(int *)(input.data_ + start) == 0x464c457f) {
        fileName[0x10] = '\0';
        for (uVar1 = 0; uVar1 != 0x10; uVar1 = uVar1 + 1) {
          if (input.data_[uVar1 + uVar6] == ' ') {
            if (uVar1 == 0) {
              uVar6 = 0;
            }
            else {
              uVar3 = (ulong)((int)uVar1 - 1);
              uVar6 = uVar1 & 0xffffffff;
              if (fileName[uVar3] == '/') {
                uVar6 = uVar3;
              }
            }
            fileName[uVar6] = '\0';
            break;
          }
          fileName[uVar1] = input.data_[uVar1 + uVar6];
        }
        ArFileEntry::ArFileEntry(&entry);
        std::__cxx11::string::assign((char *)&entry);
        ByteArray::mid((ByteArray *)&local_50,&input,start,(long)iVar5);
        ByteArray::operator=(&entry.data,(ByteArray *)&local_50);
        ByteArray::~ByteArray((ByteArray *)&local_50);
        std::vector<ArFileEntry,_std::allocator<ArFileEntry>_>::push_back
                  (__return_storage_ptr__,&entry);
        ArFileEntry::~ArFileEntry(&entry);
        sVar2 = input.size_;
      }
      uVar6 = start + (long)iVar5 + (ulong)((uint)(start + (long)iVar5) & 1);
    }
    goto LAB_001635b2;
  }
  if (*(int *)input.data_ == 0x464c457f) {
    ArFileEntry::ArFileEntry(&entry);
    ghc::filesystem::path::filename((path *)fileName,inputName);
    ghc::filesystem::path::u8string_abi_cxx11_(&local_50,(path *)fileName);
    std::__cxx11::string::operator=((string *)&entry,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    ghc::filesystem::path::~path((path *)fileName);
    ByteArray::operator=(&entry.data,&input);
    std::vector<ArFileEntry,_std::allocator<ArFileEntry>_>::push_back(__return_storage_ptr__,&entry)
    ;
    ArFileEntry::~ArFileEntry(&entry);
  }
LAB_001635b2:
  ByteArray::~ByteArray(&input);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ArFileEntry> loadArArchive(const fs::path& inputName)
{
	ByteArray input = ByteArray::fromFile(inputName);
	std::vector<ArFileEntry> result;

	if (input.size() < 8 || memcmp(input.data(),"!<arch>\n",8) != 0)
	{
		if (input.size() < 4 || memcmp(input.data(),"\x7F""ELF",4) != 0)
			return result;

		ArFileEntry entry;
		entry.name = inputName.filename().u8string();
		entry.data = input;
		result.push_back(entry);
		return result;
	}

	size_t pos = 8;
	while (pos < input.size())
	{
		ArFileHeader* header = (ArFileHeader*) input.data(pos);
		pos += sizeof(ArFileHeader);
		
		// get file size
		int size = 0;
		for (int i = 0; i < 10; i++)
		{
			if (header->fileSize[i] == ' ')
				break;

			size = size*10;
			size += (header->fileSize[i]-'0');
		}

		// only ELF files are actually interesting
		if (memcmp(input.data(pos),"\x7F""ELF",4) == 0)
		{
			// get file name
			char fileName[17];
			fileName[16] = 0;
			for (int i = 0; i < 16; i++)
			{
				if (header->fileName[i] == ' ')
				{
					// remove trailing slashes of file names
					if (i > 0 && fileName[i-1] == '/')
						i--;
					fileName[i] = 0;
					break;
				}

				fileName[i] = header->fileName[i];
			}
		
			ArFileEntry entry;
			entry.name = fileName;
			entry.data = input.mid(pos,size);
			result.push_back(entry);
		}

		pos += size;
		if (pos % 2)
			pos++;
	}

	return result;
}